

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proitems.h
# Opt level: O2

bool __thiscall
ProString::startsWith<ProString_const&,char_const(&)[2]>
          (ProString *this,QStringBuilder<const_ProString_&,_const_char_(&)[2]> *str)

{
  bool bVar1;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_30;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  QStringBuilder<const_ProString_&,_const_char_(&)[2]>::convertTo<QString>((QString *)&local_30,str)
  ;
  bVar1 = startsWith(this,(QString *)&local_30,CaseSensitive);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_30);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return bVar1;
  }
  __stack_chk_fail();
}

Assistant:

bool startsWith(const QStringBuilder<A, B> &str) { return startsWith(QString(str)); }